

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *left_child_res,
          vec<16U,_float> *right_child_res,vq_node *parent_node)

{
  pair<crnlib::vec<16U,_float>,_unsigned_int> *lhs;
  uint uVar1;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar2;
  uint i_1;
  float *pfVar3;
  row_vec *prVar4;
  float *pfVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  long lVar8;
  row_vec *prVar9;
  uint iter;
  int iVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double local_5a0;
  double local_598;
  vec<16U,_float> axis;
  vec<16U,_float> left_child;
  vec<16U,_float> right_child;
  vec<16U,_float> local_4b0;
  vec<16U,_float> prev_axis;
  matrix<16U,_16U,_float> covar;
  
  if ((parent_node->m_vectors).m_size == 2) {
    vec<16U,_float>::operator=
              (left_child_res,&(this->m_training_vecs).m_p[*(parent_node->m_vectors).m_p].first);
    vec<16U,_float>::operator=
              (right_child_res,&(this->m_training_vecs).m_p[(parent_node->m_vectors).m_p[1]].first);
    return;
  }
  matrix<16U,_16U,_float>::clear(&covar);
  for (uVar7 = 0; uVar7 < (parent_node->m_vectors).m_size; uVar7 = uVar7 + 1) {
    operator-(&(this->m_training_vecs).m_p[(parent_node->m_vectors).m_p[uVar7]].first,
              &parent_node->m_centroid);
    operator*(&axis,(float)(this->m_training_vecs).m_p[(parent_node->m_vectors).m_p[uVar7]].second);
    lVar6 = 0;
    pfVar3 = prev_axis.m_s;
    pfVar5 = (float *)&covar;
    for (; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      for (lVar8 = 0; lVar6 + lVar8 != 0x10; lVar8 = lVar8 + 1) {
        pfVar5[lVar8] = axis.m_s[lVar6] * pfVar3[lVar8] + pfVar5[lVar8];
      }
      pfVar5 = pfVar5 + 0x11;
      pfVar3 = pfVar3 + 1;
    }
  }
  uVar7 = parent_node->m_total_weight;
  pfVar3 = (float *)&covar;
  for (lVar6 = 0; lVar8 = -0x10, lVar6 != 0x10; lVar6 = lVar6 + 1) {
    for (; lVar6 + lVar8 != 0; lVar8 = lVar8 + 1) {
      pfVar3[lVar8 + 0x10] = pfVar3[lVar8 + 0x10] * (1.0 / (float)uVar7);
    }
    pfVar3 = pfVar3 + 0x11;
  }
  pfVar3 = covar.m_rows[0].m_s + 1;
  prVar4 = covar.m_rows + 1;
  for (lVar6 = 0; prVar9 = prVar4, lVar8 = -0xf, lVar6 != 0xf; lVar6 = lVar6 + 1) {
    for (; lVar6 + lVar8 != 0; lVar8 = lVar8 + 1) {
      prVar9->m_s[0] = pfVar3[lVar8 + 0xf];
      prVar9 = prVar9 + 1;
    }
    pfVar3 = pfVar3 + 0x11;
    prVar4 = (row_vec *)(prVar4[1].m_s + 1);
  }
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    axis.m_s[lVar6] = (float)(int)lVar6 * 0.06666667 * 0.5 + 0.75;
  }
  vec<16U,_float>::vec(&prev_axis,&axis);
  iVar10 = 0;
  do {
    if (iVar10 == 10) break;
    dVar13 = 0.0;
    prVar4 = covar.m_rows;
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      dVar14 = 0.0;
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        dVar14 = dVar14 + (double)(axis.m_s[lVar8] * ((row_vec *)prVar4->m_s)->m_s[lVar8]);
      }
      left_child.m_s[lVar6] = (float)dVar14;
      if (dVar13 <= ABS(dVar14)) {
        dVar13 = ABS(dVar14);
      }
      prVar4 = prVar4 + 1;
    }
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      vec<16U,_float>::operator*=(&left_child,(float)(1.0 / dVar13));
    }
    operator-(&prev_axis,&left_child);
    vec<16U,_float>::operator=(&prev_axis,&axis);
    vec<16U,_float>::operator=(&axis,&left_child);
    fVar11 = vec<16U,_float>::norm(&right_child);
    iVar10 = iVar10 + 1;
  } while (0.0025 <= fVar11);
  vec<16U,_float>::normalize(&axis,(vec<16U,_float> *)0x0);
  vec<16U,_float>::set(&left_child,0.0);
  vec<16U,_float>::set(&right_child,0.0);
  local_598 = 0.0;
  local_5a0 = 0.0;
  for (uVar7 = 0; uVar7 < (parent_node->m_vectors).m_size; uVar7 = uVar7 + 1) {
    uVar1 = (parent_node->m_vectors).m_p[uVar7];
    ppVar2 = (this->m_training_vecs).m_p;
    lhs = ppVar2 + uVar1;
    uVar1 = ppVar2[uVar1].second;
    fVar11 = (float)uVar1;
    operator-(&lhs->first,&parent_node->m_centroid);
    fVar12 = operator*(&local_4b0,&axis);
    dVar13 = (double)uVar1;
    if (0.0 <= fVar12) {
      operator*(&lhs->first,fVar11);
      vec<16U,_float>::operator+=(&right_child,&local_4b0);
      local_5a0 = local_5a0 + dVar13;
    }
    else {
      operator*(&lhs->first,fVar11);
      vec<16U,_float>::operator+=(&left_child,&local_4b0);
      local_598 = local_598 + dVar13;
    }
  }
  if ((local_598 <= 0.0) || (local_5a0 <= 0.0)) {
    compute_split_estimate(this,left_child_res,right_child_res,parent_node);
  }
  else {
    operator*(&left_child,(float)(1.0 / local_598));
    vec<16U,_float>::operator=(left_child_res,&local_4b0);
    operator*(&right_child,(float)(1.0 / local_5a0));
    vec<16U,_float>::operator=(right_child_res,&local_4b0);
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }